

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O0

bool __thiscall rotate_y::hit(rotate_y *this,ray *r,double t_min,double t_max,hit_record *rec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  double *pdVar6;
  element_type *peVar7;
  time_t *__timer;
  bool bVar8;
  double time;
  undefined1 local_190 [8];
  vec3 normal;
  vec3 p;
  ray rotated_r;
  vec3 local_110;
  vec3 local_f8;
  vec3 local_e0;
  vec3 local_c8;
  vec3 local_b0;
  vec3 local_98;
  vec3 local_80;
  undefined1 local_68 [8];
  vec3 direction;
  vec3 origin;
  hit_record *rec_local;
  double t_max_local;
  double t_min_local;
  ray *r_local;
  rotate_y *this_local;
  
  ray::origin((vec3 *)(direction.e + 2),r);
  ray::direction((vec3 *)local_68,r);
  dVar1 = this->cos_theta;
  ray::origin(&local_80,r);
  pdVar6 = vec3::operator[](&local_80,0);
  dVar2 = *pdVar6;
  dVar3 = this->sin_theta;
  ray::origin(&local_98,r);
  pdVar6 = vec3::operator[](&local_98,2);
  dVar4 = *pdVar6;
  pdVar6 = vec3::operator[]((vec3 *)(direction.e + 2),0);
  *pdVar6 = dVar1 * dVar2 + -(dVar3 * dVar4);
  dVar1 = this->sin_theta;
  ray::origin(&local_b0,r);
  pdVar6 = vec3::operator[](&local_b0,0);
  dVar2 = *pdVar6;
  dVar3 = this->cos_theta;
  ray::origin(&local_c8,r);
  pdVar6 = vec3::operator[](&local_c8,2);
  dVar4 = *pdVar6;
  pdVar6 = vec3::operator[]((vec3 *)(direction.e + 2),2);
  *pdVar6 = dVar1 * dVar2 + dVar3 * dVar4;
  dVar1 = this->cos_theta;
  ray::direction(&local_e0,r);
  pdVar6 = vec3::operator[](&local_e0,0);
  dVar2 = *pdVar6;
  dVar3 = this->sin_theta;
  ray::direction(&local_f8,r);
  pdVar6 = vec3::operator[](&local_f8,2);
  dVar4 = *pdVar6;
  pdVar6 = vec3::operator[]((vec3 *)local_68,0);
  *pdVar6 = dVar1 * dVar2 + -(dVar3 * dVar4);
  dVar1 = this->sin_theta;
  ray::direction(&local_110,r);
  pdVar6 = vec3::operator[](&local_110,0);
  dVar2 = *pdVar6;
  dVar3 = this->cos_theta;
  ray::direction((vec3 *)&rotated_r.tm,r);
  pdVar6 = vec3::operator[]((vec3 *)&rotated_r.tm,2);
  dVar4 = *pdVar6;
  __timer = (time_t *)0x2;
  pdVar6 = vec3::operator[]((vec3 *)local_68,2);
  *pdVar6 = dVar1 * dVar2 + dVar3 * dVar4;
  ray::time(r,__timer);
  ray::ray((ray *)(p.e + 2),(vec3 *)(direction.e + 2),(vec3 *)local_68,time);
  peVar7 = std::__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->ptr);
  uVar5 = (**peVar7->_vptr_hittable)(t_min,t_max,peVar7,p.e + 2,rec);
  bVar8 = (uVar5 & 1) != 0;
  if (bVar8) {
    normal.e[2] = (rec->p).e[0];
    p.e[0] = (rec->p).e[1];
    p.e[1] = (rec->p).e[2];
    local_190 = (undefined1  [8])(rec->normal).e[0];
    normal.e[0] = (rec->normal).e[1];
    normal.e[1] = (rec->normal).e[2];
    dVar1 = this->cos_theta;
    pdVar6 = vec3::operator[](&rec->p,0);
    dVar2 = *pdVar6;
    dVar3 = this->sin_theta;
    pdVar6 = vec3::operator[](&rec->p,2);
    dVar4 = *pdVar6;
    pdVar6 = vec3::operator[]((vec3 *)(normal.e + 2),0);
    *pdVar6 = dVar1 * dVar2 + dVar3 * dVar4;
    dVar1 = this->sin_theta;
    pdVar6 = vec3::operator[](&rec->p,0);
    dVar2 = *pdVar6;
    dVar3 = this->cos_theta;
    pdVar6 = vec3::operator[](&rec->p,2);
    dVar4 = *pdVar6;
    pdVar6 = vec3::operator[]((vec3 *)(normal.e + 2),2);
    *pdVar6 = -dVar1 * dVar2 + dVar3 * dVar4;
    dVar1 = this->cos_theta;
    pdVar6 = vec3::operator[](&rec->normal,0);
    dVar2 = *pdVar6;
    dVar3 = this->sin_theta;
    pdVar6 = vec3::operator[](&rec->normal,2);
    dVar4 = *pdVar6;
    pdVar6 = vec3::operator[]((vec3 *)local_190,0);
    *pdVar6 = dVar1 * dVar2 + dVar3 * dVar4;
    dVar1 = this->sin_theta;
    pdVar6 = vec3::operator[](&rec->normal,0);
    dVar2 = *pdVar6;
    dVar3 = this->cos_theta;
    pdVar6 = vec3::operator[](&rec->normal,2);
    dVar4 = *pdVar6;
    pdVar6 = vec3::operator[]((vec3 *)local_190,2);
    *pdVar6 = -dVar1 * dVar2 + dVar3 * dVar4;
    (rec->p).e[0] = normal.e[2];
    (rec->p).e[1] = p.e[0];
    (rec->p).e[2] = p.e[1];
    hit_record::set_face_normal(rec,(ray *)(p.e + 2),(vec3 *)local_190);
  }
  return bVar8;
}

Assistant:

bool rotate_y::hit(const ray& r, double t_min, double t_max, hit_record& rec) const {
    vec3 origin = r.origin();
    vec3 direction = r.direction();

    origin[0] = cos_theta*r.origin()[0] - sin_theta*r.origin()[2];
    origin[2] = sin_theta*r.origin()[0] + cos_theta*r.origin()[2];

    direction[0] = cos_theta*r.direction()[0] - sin_theta*r.direction()[2];
    direction[2] = sin_theta*r.direction()[0] + cos_theta*r.direction()[2];

    ray rotated_r(origin, direction, r.time());

    if (!ptr->hit(rotated_r, t_min, t_max, rec))
        return false;

    vec3 p = rec.p;
    vec3 normal = rec.normal;

    p[0] =  cos_theta*rec.p[0] + sin_theta*rec.p[2];
    p[2] = -sin_theta*rec.p[0] + cos_theta*rec.p[2];

    normal[0] =  cos_theta*rec.normal[0] + sin_theta*rec.normal[2];
    normal[2] = -sin_theta*rec.normal[0] + cos_theta*rec.normal[2];

    rec.p = p;
    rec.set_face_normal(rotated_r, normal);

    return true;
}